

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall Scene::~Scene(Scene *this)

{
  Camera *this_00;
  pointer ppLVar1;
  pointer ppOVar2;
  pointer ppLVar3;
  pointer ppOVar4;
  
  this_00 = this->m_camera;
  if (this_00 != (Camera *)0x0) {
    Camera::~Camera(this_00);
    operator_delete(this_00);
  }
  ppLVar1 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar3 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar3 != ppLVar1; ppLVar3 = ppLVar3 + 1) {
    if (*ppLVar3 != (Light *)0x0) {
      (*(*ppLVar3)->_vptr_Light[1])();
    }
  }
  ppOVar2 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppOVar4 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppOVar4 != ppOVar2; ppOVar4 = ppOVar4 + 1) {
    if (*ppOVar4 != (Object *)0x0) {
      (*(*ppOVar4)->_vptr_Object[1])();
    }
  }
  ppLVar3 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar3) {
    (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar3;
  }
  ppOVar4 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppOVar4) {
    (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppOVar4;
  }
  if (ppOVar4 != (pointer)0x0) {
    operator_delete(ppOVar4);
    ppLVar3 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppLVar3 != (pointer)0x0) {
    operator_delete(ppLVar3);
    return;
  }
  return;
}

Assistant:

Scene::~Scene()
{
    if (m_camera) delete m_camera;
    for (auto i : m_lights) delete i;
    for (auto i : m_objects) delete i;
    m_lights.clear();
    m_objects.clear();
}